

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

void hmm_normalize(hmm_t *h,int32 bestscr)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  bVar1 = h->n_emit_state;
  if (bVar1 != 0) {
    lVar3 = 0;
    do {
      iVar2 = *(int *)((long)&h->state[0].score + lVar3);
      if (-0x38000000 < iVar2) {
        *(int *)((long)&h->state[0].score + lVar3) = iVar2 - bestscr;
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)bVar1 * 0x10 != lVar3);
  }
  iVar2 = (h->out).score;
  if (-0x38000000 < iVar2) {
    (h->out).score = iVar2 - bestscr;
  }
  return;
}

Assistant:

void
hmm_normalize(hmm_t *h, int32 bestscr)
{
    int32 i;

    for (i = 0; i < hmm_n_emit_state(h); i++) {
        if (hmm_score(h, i) > WORST_SCORE)
            hmm_score(h, i) -= bestscr;
    }
    if (hmm_out_score(h) > WORST_SCORE)
        hmm_out_score(h) -= bestscr;
}